

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qminimalbackingstore.cpp
# Opt level: O0

void __thiscall
QMinimalBackingStore::resize(QMinimalBackingStore *this,QSize *size,QRegion *param_3)

{
  bool bVar1;
  Format FVar2;
  long *plVar3;
  QSize *in_RSI;
  QSize *in_RDI;
  long in_FS_OFFSET;
  Format format;
  QSize *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb8;
  QImage local_28 [24];
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QGuiApplication::primaryScreen();
  plVar3 = (long *)QScreen::handle();
  FVar2 = (**(code **)(*plVar3 + 0x38))();
  local_10 = QImage::size();
  bVar1 = operator!=(in_RDI,in_stack_ffffffffffffffa8);
  if (bVar1) {
    QImage::QImage(local_28,in_RSI,FVar2);
    QImage::operator=((QImage *)CONCAT44(FVar2,in_stack_ffffffffffffffb8),(QImage *)in_RDI);
    QImage::~QImage(local_28);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMinimalBackingStore::resize(const QSize &size, const QRegion &)
{
    QImage::Format format = QGuiApplication::primaryScreen()->handle()->format();
    if (mImage.size() != size)
        mImage = QImage(size, format);
}